

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O0

int read_timings(nvamemtiming_conf *conf)

{
  byte *pbVar1;
  long in_RDI;
  uint8_t *header;
  int local_4;
  
  printf("timing table at: %x\n",(ulong)*(ushort *)(in_RDI + 0x2a));
  pbVar1 = (byte *)(*(long *)(in_RDI + 0x20) + (ulong)*(ushort *)(in_RDI + 0x2a));
  if (*pbVar1 == 0x10) {
    if (*(byte *)(in_RDI + 0x30) < pbVar1[2]) {
      *(ushort *)(in_RDI + 0x2e) = (ushort)pbVar1[3];
      *(ushort *)(in_RDI + 0x2c) =
           *(short *)(in_RDI + 0x2a) + (ushort)pbVar1[1] +
           (ushort)*(byte *)(in_RDI + 0x30) * (ushort)pbVar1[3];
      if (*(int *)(in_RDI + 0xc) == 3) {
        *(ushort *)(in_RDI + 0x12) =
             *(short *)(in_RDI + 0x2a) + (ushort)pbVar1[1] +
             (ushort)*(byte *)(in_RDI + 0x10) * (ushort)pbVar1[3];
      }
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"timing entry %i is higher than count(%i)\n",(ulong)*(byte *)(in_RDI + 0x30),
              (ulong)pbVar1[2]);
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"unknow table version %x\n",(ulong)*pbVar1);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int read_timings(struct nvamemtiming_conf *conf)
{
	uint8_t *header;

	printf("timing table at: %x\n", conf->vbios.timing_table_offset);
	header = &conf->vbios.data[conf->vbios.timing_table_offset];
	if (header[0] != 0x10) {
		fprintf(stderr, "unknow table version %x\n", header[0]);
		return -1;
	}

	if (conf->timing.entry >= header[2]) {
		fprintf(stderr, "timing entry %i is higher than count(%i)\n", conf->timing.entry, header[2]);
		return -1;
	}

	conf->vbios.timing_entry_length = header[3];
	conf->vbios.timing_entry_offset = conf->vbios.timing_table_offset + header[1] + conf->timing.entry * header[3];

	if (conf->mode == MODE_DEEP)
		conf->deep.timing_entry_offset = conf->vbios.timing_table_offset + header[1] + conf->deep.entry * header[3];

	return 0;
}